

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_t.cpp
# Opt level: O0

bool __thiscall deci::value_equal_to_t::operator()(value_equal_to_t *this,value_t *lhs,value_t *rhs)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  value_t *pvVar4;
  value_t *pvVar5;
  runtime_error *prVar6;
  double dVar7;
  double dVar8;
  type_t lhsType;
  value_t *rhs_local;
  value_t *lhs_local;
  value_equal_to_t *this_local;
  
  iVar1 = (*lhs->_vptr_value_t[1])();
  iVar2 = (*rhs->_vptr_value_t[1])();
  if (iVar1 == iVar2) {
    switch(iVar1) {
    case 0:
      dVar7 = number_t::Value((number_t *)lhs);
      dVar8 = number_t::Value((number_t *)rhs);
      this_local._7_1_ = dVar7 == dVar8;
      break;
    case 1:
      psVar3 = string_t::Value_abi_cxx11_((string_t *)lhs);
      string_t::Value_abi_cxx11_((string_t *)rhs);
      iVar1 = std::__cxx11::string::compare((string *)psVar3);
      this_local._7_1_ = iVar1 == 0;
      break;
    case 2:
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Array comparison is not possible");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 3:
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Dictionary comparison is not possible");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case 4:
      this_local._7_1_ = lhs == rhs;
      break;
    case 5:
      pvVar4 = reference_t::Dereference((reference_t *)lhs);
      pvVar5 = reference_t::Dereference((reference_t *)rhs);
      this_local._7_1_ = pvVar4 == pvVar5;
      break;
    case 6:
      this_local._7_1_ = true;
      break;
    default:
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Unknown data type");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool value_equal_to_t::operator() (const value_t* lhs, const value_t* rhs) const {
    value_t::type_t lhsType = lhs->Type();

    if (lhsType != rhs->Type()) {
      return false;
    }

    switch(lhsType) {
    case value_t::NUMBER:
      return static_cast<const number_t*>(lhs)->Value()
        == static_cast<const number_t*>(rhs)->Value();
    case value_t::STRING:
      return static_cast<const string_t*>(lhs)->Value().compare(
        static_cast<const string_t*>(rhs)->Value()
      ) == 0;
    case value_t::ARRAY:
      throw std::runtime_error("Array comparison is not possible");
    case value_t::DICTIONARY:
      throw std::runtime_error("Dictionary comparison is not possible");
    case value_t::FUNCTION:
      return lhs == rhs;
    case value_t::REFERENCE:
      return &(static_cast<const reference_t*>(lhs)->Dereference())
        == &(static_cast<const reference_t*>(rhs)->Dereference());
    case value_t::NOTHING:
      return true;
    default:
      throw std::runtime_error("Unknown data type");
    }
  }